

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.hpp
# Opt level: O0

void __thiscall
miyuki::serialize::InputArchive::InputArchive(InputArchive *this,Context *context,json *data)

{
  json *data_local;
  Context *context_local;
  InputArchive *this_local;
  
  ArchiveBase::ArchiveBase(&this->super_ArchiveBase);
  this->context = context;
  this->data = data;
  std::
  vector<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
  ::vector(&this->stack);
  std::
  unordered_map<unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>_>_>
  ::unordered_map(&this->ptrs);
  std::vector<int,_std::allocator<int>_>::vector(&this->counter);
  std::
  vector<std::reference_wrapper<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const>,std::allocator<std::reference_wrapper<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const>>>
  ::
  emplace_back<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const&>
            ((vector<std::reference_wrapper<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const>,std::allocator<std::reference_wrapper<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const>>>
              *)&this->stack,data);
  return;
}

Assistant:

explicit InputArchive(Context &context, const json::json &data) : context(context), data(data) {
            stack.emplace_back(data);
        }